

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

void json11::dump(string *value,string *out)

{
  byte bVar1;
  pointer pcVar2;
  char cVar3;
  ulong uVar4;
  char buf [8];
  char acStack_38 [8];
  
  cVar3 = (char)out;
  std::__cxx11::string::push_back(cVar3);
  if (value->_M_string_length != 0) {
    uVar4 = 0;
    do {
      pcVar2 = (value->_M_dataplus)._M_p;
      bVar1 = pcVar2[uVar4];
      switch(bVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
switchD_00109509_caseD_b:
        if (bVar1 < 0x20) {
          snprintf(acStack_38,8,"\\u%04x");
          break;
        }
        if (((bVar1 == 0xe2) && (pcVar2[uVar4 + 1] == -0x80)) && (pcVar2[uVar4 + 2] == -0x58)) {
          std::__cxx11::string::append((char *)out);
          uVar4 = uVar4 + 2;
        }
        else {
          std::__cxx11::string::push_back(cVar3);
        }
        goto LAB_00109591;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if ((bVar1 != 0x22) && (bVar1 != 0x5c)) goto switchD_00109509_caseD_b;
      }
      std::__cxx11::string::append((char *)out);
LAB_00109591:
      uVar4 = uVar4 + 1;
    } while (uVar4 < value->_M_string_length);
  }
  std::__cxx11::string::push_back(cVar3);
  return;
}

Assistant:

static void dump(const string &value, string &out) {
    out += '"';
    for (size_t i = 0; i < value.length(); i++) {
        const char ch = value[i];
        if (ch == '\\') {
            out += "\\\\";
        } else if (ch == '"') {
            out += "\\\"";
        } else if (ch == '\b') {
            out += "\\b";
        } else if (ch == '\f') {
            out += "\\f";
        } else if (ch == '\n') {
            out += "\\n";
        } else if (ch == '\r') {
            out += "\\r";
        } else if (ch == '\t') {
            out += "\\t";
        } else if (static_cast<uint8_t>(ch) <= 0x1f) {
            char buf[8];
            snprintf(buf, sizeof buf, "\\u%04x", ch);
            out += buf;
        } else if (static_cast<uint8_t>(ch) == 0xe2 && static_cast<uint8_t>(value[i+1]) == 0x80
                   && static_cast<uint8_t>(value[i+2]) == 0xa8) {
            out += "\\u2028";
            i += 2;
        } else if (static_cast<uint8_t>(ch) == 0xe2 && static_cast<uint8_t>(value[i+1]) == 0x80
                   && static_cast<uint8_t>(value[i+2]) == 0xa9) {
            out += "\\u2029";
            i += 2;
        } else {
            out += ch;
        }
    }
    out += '"';
}